

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrLocationSetRemove(xmlLocationSetPtr cur,int val)

{
  long lVar1;
  int iVar2;
  xmlXPathObjectPtr *ppxVar3;
  long lVar4;
  
  if ((cur != (xmlLocationSetPtr)0x0) && (iVar2 = cur->locNr, val < iVar2)) {
    lVar1 = (long)iVar2 + -1;
    cur->locNr = (int)lVar1;
    for (lVar4 = (long)val; ppxVar3 = cur->locTab, lVar4 < lVar1; lVar4 = lVar4 + 1) {
      ppxVar3[lVar4] = ppxVar3[lVar4 + 1];
    }
    ppxVar3[(long)iVar2 + -1] = (xmlXPathObjectPtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPtrLocationSetRemove(xmlLocationSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->locNr) return;
    cur->locNr--;
    for (;val < cur->locNr;val++)
        cur->locTab[val] = cur->locTab[val + 1];
    cur->locTab[cur->locNr] = NULL;
}